

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::Animation::Animation(Animation *this,Skeleton *parent)

{
  Skeleton *parent_local;
  Animation *this_local;
  
  this->parentMesh = (Mesh *)0x0;
  this->parentSkeleton = parent;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->baseName);
  this->length = 0.0;
  this->baseTime = -1.0;
  std::
  vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>::
  vector(&this->tracks);
  return;
}

Assistant:

Animation::Animation(Skeleton *parent) :
    parentMesh(NULL),
    parentSkeleton(parent),
    length(0.0f),
    baseTime(-1.0f)
{
}